

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O2

void glfwGetWindowFrameSize(GLFWwindow *handle,int *left,int *top,int *right,int *bottom)

{
  int iVar1;
  unsigned_long uVar2;
  _GLFWwindow *window;
  double dVar3;
  double dVar4;
  int *e;
  timeval tStack_100;
  undefined1 auStack_f0 [192];
  
  if (left != (int *)0x0) {
    *left = 0;
  }
  if (top != (int *)0x0) {
    *top = 0;
  }
  if (right != (int *)0x0) {
    *right = 0;
  }
  if (bottom != (int *)0x0) {
    *bottom = 0;
  }
  if (_glfwInitialized == '\0') {
    _glfwInputError(0x10001,(char *)0x0);
    return;
  }
  e = (int *)0x0;
  if (_glfw.x11.NET_FRAME_EXTENTS == 0) {
    return;
  }
  iVar1 = _glfwPlatformWindowVisible((_GLFWwindow *)handle);
  if (_glfw.x11.NET_REQUEST_FRAME_EXTENTS != 0 && iVar1 == 0) {
    sendEventToWM((_GLFWwindow *)handle,_glfw.x11.NET_REQUEST_FRAME_EXTENTS,0,0,0,0,(long)e);
    dVar3 = _glfwPlatformGetTime();
    while (iVar1 = XCheckIfEvent(_glfw.x11.display,auStack_f0,isFrameExtentsEvent,handle),
          iVar1 == 0) {
      dVar4 = _glfwPlatformGetTime();
      dVar4 = (dVar3 + 0.5) - dVar4;
      if (dVar4 <= 0.0) {
        _glfwInputError(0x10008,
                        "X11: The window manager has a broken _NET_REQUEST_FRAME_EXTENTS implementation; please report this issue"
                       );
        return;
      }
      tStack_100.tv_sec = 0;
      tStack_100.tv_usec = (__suseconds_t)(dVar4 * 1000000.0);
      selectDisplayConnection(&tStack_100);
    }
  }
  uVar2 = _glfwGetWindowProperty
                    (*(Window *)(handle + 0x288),_glfw.x11.NET_FRAME_EXTENTS,6,
                     (uchar **)&stack0xfffffffffffffed8);
  if (uVar2 == 4) {
    if (left != (int *)0x0) {
      *left = *e;
    }
    if (top != (int *)0x0) {
      *top = e[4];
    }
    if (right != (int *)0x0) {
      *right = e[2];
    }
    if (bottom != (int *)0x0) {
      *bottom = e[6];
      goto LAB_0010e472;
    }
  }
  if (e == (int *)0x0) {
    return;
  }
LAB_0010e472:
  XFree();
  return;
}

Assistant:

GLFWAPI void glfwGetWindowFrameSize(GLFWwindow* handle,
                                    int* left, int* top,
                                    int* right, int* bottom)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;

    if (left)
        *left = 0;
    if (top)
        *top = 0;
    if (right)
        *right = 0;
    if (bottom)
        *bottom = 0;

    _GLFW_REQUIRE_INIT();
    _glfwPlatformGetWindowFrameSize(window, left, top, right, bottom);
}